

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

BSSRDFSample * __thiscall
pbrt::TabulatedBSSRDF::ProbeIntersectionToSample
          (BSSRDFSample *__return_storage_ptr__,TabulatedBSSRDF *this,SubsurfaceInteraction *si,
          NormalizedFresnelBxDF *bxdf)

{
  undefined1 auVar1 [16];
  Float FVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  SampledSpectrum SVar9;
  Point3f PVar10;
  BSDF bsdf;
  BxDFHandle local_a0;
  Tuple3<pbrt::Point3,_float> local_98;
  Tuple3<pbrt::Point3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  BSDF local_68;
  undefined1 auVar6 [56];
  undefined1 auVar8 [56];
  
  bxdf->eta = this->eta;
  local_78.z = (si->ns).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar6 = (undefined1  [56])0x0;
  local_78.x = (si->ns).super_Tuple3<pbrt::Normal3,_float>.x;
  local_78.y = (si->ns).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar8 = (undefined1  [56])0x0;
  local_a0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)bxdf | 0xa000000000000);
  BSDF::BSDF(&local_68,(Vector3f *)&local_78,&si->n,&si->ns,&si->dpdus,&local_a0);
  PVar10 = SubsurfaceInteraction::p(si);
  local_88.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_88._0_8_ = vmovlps_avx(auVar3._0_16_);
  SVar9 = Sp(this,(Point3f *)&local_88);
  auVar7._0_8_ = SVar9.values.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = SVar9.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  auVar1 = vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
  auVar6 = ZEXT856(auVar1._8_8_);
  *(undefined1 (*) [16])(__return_storage_ptr__->Sp).values.values = auVar1;
  PVar10 = SubsurfaceInteraction::p(si);
  local_98.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_98._0_8_ = vmovlps_avx(auVar5._0_16_);
  FVar2 = PDF_Sp(this,(Point3f *)&local_98,&si->n);
  __return_storage_ptr__->pdf = FVar2;
  (__return_storage_ptr__->Sw).bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (uintptr_t)
          local_68.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame._20_8_;
  (__return_storage_ptr__->Sw).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.x =
       local_68.ng.super_Tuple3<pbrt::Normal3,_float>.x;
  (__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.y =
       local_68.ng.super_Tuple3<pbrt::Normal3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->Sw).ng.super_Tuple3<pbrt::Normal3,_float>.z =
       local_68._16_8_;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->Sw).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_68.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->Sw).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_68.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = local_78.x;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y = local_78.y;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = local_78.z;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSSRDFSample ProbeIntersectionToSample(const SubsurfaceInteraction &si,
                                           NormalizedFresnelBxDF *bxdf) const {
        *bxdf = NormalizedFresnelBxDF(eta);
        Vector3f wo = Vector3f(si.ns);
        BSDF bsdf(wo, si.n, si.ns, si.dpdus, bxdf);
        return BSSRDFSample{Sp(si.p()), PDF_Sp(si.p(), si.n), bsdf, wo};
    }